

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O2

void phosg::skip_whitespace_and_comments(StringReader *r,bool disable_extensions)

{
  bool bVar1;
  int8_t iVar2;
  size_t sVar3;
  bool bVar4;
  
  bVar4 = false;
  do {
    bVar1 = StringReader::eof(r);
    if (bVar1) {
      return;
    }
    iVar2 = StringReader::get_s8(r,false);
    if (bVar4) {
      bVar4 = iVar2 != '\n' && iVar2 != '\r';
    }
    else if (iVar2 == '/' && !disable_extensions) {
      sVar3 = StringReader::where(r);
      iVar2 = StringReader::pget_s8(r,sVar3 + 1);
      bVar4 = true;
      if (iVar2 != '/') {
        return;
      }
    }
    else {
      if (0x17 < (byte)(iVar2 - 9U)) {
        return;
      }
      if ((0x800013U >> ((byte)(iVar2 - 9U) & 0x1f) & 1) == 0) {
        return;
      }
      bVar4 = false;
    }
    StringReader::get_s8(r,true);
  } while( true );
}

Assistant:

static void skip_whitespace_and_comments(StringReader& r, bool disable_extensions) {
  bool reading_comment = false;
  while (!r.eof()) {
    char ch = r.get_s8(false);
    if (reading_comment) {
      if ((ch == '\n') || (ch == '\r')) {
        reading_comment = false;
      }
    } else {
      if (!disable_extensions && (ch == '/') && (r.pget_s8(r.where() + 1) == '/')) {
        reading_comment = true;
      } else if ((ch != ' ') && (ch != '\t') && (ch != '\r') && (ch != '\n')) {
        return;
      }
    }
    r.get_s8();
  }
}